

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O0

Bounds3f *
pbrt::detail::
DispatchCPU<pbrt::Primitive::Bounds()const::__0&,pbrt::Bounds3<float>,pbrt::SimplePrimitive,pbrt::GeometricPrimitive,pbrt::TransformedPrimitive,pbrt::AnimatedPrimitive,pbrt::BVHAggregate,pbrt::KdTreeAggregate>
          (anon_class_1_0_00000001 *func,void *ptr,int index)

{
  anon_class_1_0_00000001 *this;
  uint in_ECX;
  Bounds3f *in_RDI;
  AnimatedPrimitive *in_stack_ffffffffffffffc8;
  
  this = (anon_class_1_0_00000001 *)(ulong)in_ECX;
  switch(this) {
  case (anon_class_1_0_00000001 *)0x0:
    const::$_0::operator()(this,(SimplePrimitive *)in_stack_ffffffffffffffc8);
    break;
  case (anon_class_1_0_00000001 *)0x1:
    const::$_0::operator()(this,(GeometricPrimitive *)in_stack_ffffffffffffffc8);
    break;
  case (anon_class_1_0_00000001 *)0x2:
    const::$_0::operator()(this,(TransformedPrimitive *)in_stack_ffffffffffffffc8);
    break;
  case (anon_class_1_0_00000001 *)0x3:
    const::$_0::operator()(this,in_stack_ffffffffffffffc8);
    break;
  case (anon_class_1_0_00000001 *)0x4:
    const::$_0::operator()(this,(BVHAggregate *)in_stack_ffffffffffffffc8);
    break;
  default:
    const::$_0::operator()(this,(KdTreeAggregate *)in_stack_ffffffffffffffc8);
  }
  return in_RDI;
}

Assistant:

auto DispatchCPU(F &&func, const void *ptr, int index) {
    DCHECK_GE(index, 0);
    DCHECK_LT(index, 6);

    switch (index) {
    case 0:
        return func((const T0 *)ptr);
    case 1:
        return func((const T1 *)ptr);
    case 2:
        return func((const T2 *)ptr);
    case 3:
        return func((const T3 *)ptr);
    case 4:
        return func((const T4 *)ptr);
    default:
        return func((const T5 *)ptr);
    }
}